

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void sk_proxy_set_frozen(Socket *s,_Bool is_frozen)

{
  size_t sVar1;
  bool bVar2;
  undefined1 local_238 [8];
  ptrlen data;
  char databuf [512];
  ProxySocket *ps;
  _Bool is_frozen_local;
  Socket *s_local;
  
  if (s[-10].vt == (SocketVtable *)0x0) {
    sVar1 = bufchain_size((bufchain *)(s + -0x10));
    if (sVar1 != 0) {
      *(_Bool *)((long)&s[-0xb].vt + 1) = is_frozen;
      while( true ) {
        bVar2 = false;
        if (((ulong)s[-0xb].vt & 0x100) == 0) {
          sVar1 = bufchain_size((bufchain *)(s + -0x10));
          bVar2 = sVar1 != 0;
        }
        if (!bVar2) break;
        _local_238 = bufchain_prefix((bufchain *)(s + -0x10));
        if ((void *)0x200 < data.ptr) {
          data.ptr = (void *)0x200;
        }
        memcpy(&data.len,(void *)local_238,(size_t)data.ptr);
        bufchain_consume((bufchain *)(s + -0x10),(size_t)data.ptr);
        plug_receive((Plug *)s[-0x1f].vt,0,(char *)&data.len,(size_t)data.ptr);
      }
      if (((ulong)s[-0xb].vt & 0x100) != 0) {
        return;
      }
    }
    sk_set_frozen((Socket *)s[-0x20].vt,is_frozen);
  }
  else {
    *(_Bool *)((long)&s[-0xb].vt + 1) = is_frozen;
  }
  return;
}

Assistant:

static void sk_proxy_set_frozen (Socket *s, bool is_frozen)
{
    ProxySocket *ps = container_of(s, ProxySocket, sock);

    if (ps->pn) {
        ps->freeze = is_frozen;
        return;
    }

    /* handle any remaining buffered recv data first */
    if (bufchain_size(&ps->pending_input_data) > 0) {
        ps->freeze = is_frozen;

        /* loop while we still have buffered data, and while we are
         * unfrozen. the plug_receive call in the loop could result
         * in a call back into this function refreezing the socket,
         * so we have to check each time.
         */
        while (!ps->freeze && bufchain_size(&ps->pending_input_data) > 0) {
            char databuf[512];
            ptrlen data = bufchain_prefix(&ps->pending_input_data);
            if (data.len > lenof(databuf))
                data.len = lenof(databuf);
            memcpy(databuf, data.ptr, data.len);
            bufchain_consume(&ps->pending_input_data, data.len);
            plug_receive(ps->plug, 0, databuf, data.len);
        }

        /* if we're still frozen, we'll have to wait for another
         * call from the backend to finish unbuffering the data.
         */
        if (ps->freeze) return;
    }

    sk_set_frozen(ps->sub_socket, is_frozen);
}